

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineMapper.h
# Opt level: O3

tuple<double,_long,_double,_long> * __thiscall
anurbs::PolylineMapper<3L>::map
          (tuple<double,_long,_double,_long> *__return_storage_ptr__,PolylineMapper<3L> *this,
          Vector *point,double tolerance)

{
  long lVar1;
  pointer pMVar2;
  bool bVar3;
  Index i;
  long lVar4;
  pointer plVar5;
  double dVar6;
  double dVar7;
  double dVar9;
  undefined1 auVar8 [16];
  undefined4 uVar10;
  undefined4 uVar11;
  vector<long,_std::allocator<long>_> indices;
  Vector box_b;
  Vector box_a;
  Vector line_b;
  Vector line_a;
  vector<long,_std::allocator<long>_> local_170;
  double local_158 [4];
  double local_138 [4];
  tuple<double,_long,_double,_long> *local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  _Any_data local_f8;
  code *local_e8;
  undefined8 uStack_e0;
  double local_d8;
  Vector local_c8;
  Vector local_a8;
  pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> local_88;
  Vector local_68;
  Vector local_48;
  
  local_138[2] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[2];
  local_138[0] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[0];
  local_138[1] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[1];
  local_158[2] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[2];
  local_158[0] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[0];
  local_158[1] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[1];
  lVar4 = 0;
  do {
    local_138[lVar4] = local_138[lVar4] + tolerance;
    local_158[lVar4] = local_158[lVar4] - tolerance;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       local_138[0];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       local_138[1];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       local_138[2];
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       local_158[0];
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       local_158[1];
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       local_158[2];
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e8 = (code *)0x0;
  uStack_e0 = 0;
  local_d8 = tolerance;
  RTree<3L>::by_box(&local_170,&this->m_rtree,&local_48,&local_68,(Callback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if (local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar10 = 0;
    uVar11 = 0;
    lVar4 = 0;
  }
  else {
    uVar10 = 0;
    uVar11 = 0;
    local_108 = ZEXT816(0x7ff0000000000000);
    lVar4 = 0;
    plVar5 = local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_118 = __return_storage_ptr__;
    do {
      local_110 = CONCAT44(uVar11,uVar10);
      lVar1 = *plVar5;
      pMVar2 = (this->m_points).
               super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [2] = *(double *)
             ((long)&pMVar2[lVar1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage + 0x10);
      local_a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [0] = *(double *)
             &pMVar2[lVar1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage;
      local_a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [1] = *(double *)
             ((long)&pMVar2[lVar1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage + 8);
      local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [2] = *(double *)
             ((long)&pMVar2[lVar1 + 1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage + 0x10);
      local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [0] = *(double *)
             &pMVar2[lVar1 + 1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
              m_storage;
      local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [1] = *(double *)
             ((long)&pMVar2[lVar1 + 1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage + 8);
      Line<3L>::closest_point(&local_88,point,&local_a8,&local_c8,false);
      dVar6 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
              .array[0] -
              local_88.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
              .m_data.array[0];
      dVar9 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
              .array[1] -
              local_88.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
              .m_data.array[1];
      dVar7 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
              .array[2] -
              local_88.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
              .m_data.array[2];
      auVar8._0_8_ = dVar7 * dVar7 + dVar9 * dVar9 + dVar6 * dVar6;
      auVar8._8_8_ = 0;
      auVar8 = sqrtpd(auVar8,auVar8);
      dVar6 = auVar8._0_8_;
      bVar3 = dVar6 <= (double)local_108._0_8_;
      if (bVar3 && dVar6 <= local_d8) {
        lVar4 = lVar1;
      }
      uVar10 = (undefined4)local_110;
      uVar11 = (undefined4)((ulong)local_110 >> 0x20);
      if (bVar3 && dVar6 <= local_d8) {
        uVar10 = SUB84(local_88.first,0);
        uVar11 = (undefined4)((ulong)local_88.first >> 0x20);
        local_108 = auVar8;
      }
      plVar5 = plVar5 + 1;
      __return_storage_ptr__ = local_118;
    } while (plVar5 != local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
  super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl = lVar4 + 1;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
  super__Head_base<2UL,_double,_false>._M_head_impl = (double)CONCAT44(uVar11,uVar10);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Tuple_impl<1UL,_long,_double,_long>.super__Head_base<1UL,_long,_false>._M_head_impl = lVar4
  ;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Head_base<0UL,_double,_false>._M_head_impl = 1.0 - (double)CONCAT44(uVar11,uVar10);
  if (local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<double, Index, double, Index> map(const Vector point, const double tolerance)
    {
        Vector box_a = point;
        Vector box_b = point;
        
        for (Index i = 0; i < TDimension; i++) {
            box_a[i] += tolerance;
            box_b[i] -= tolerance;
        }

        const auto indices = m_rtree.by_box(box_a, box_b);

        double closest_distance = Infinity;
        double closest_parameter = 0;
        Index closest_index = 0;

        for (const Index i : indices) {
            Vector line_a = m_points[i];
            Vector line_b = m_points[i + 1];

            const auto [t, cp] = Line<TDimension>::closest_point(point, line_a, line_b);

            const double distance = (point - cp).norm();

            if (distance > closest_distance || distance > tolerance) {
                continue;
            }
            
            closest_distance = distance;
            closest_parameter = t;
            closest_index = i;
        }

        return {1.0 - closest_parameter, closest_index, closest_parameter, closest_index + 1};
    }